

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_14a672::BuildEngineImpl::demandRule(BuildEngineImpl *this,RuleInfo *ruleInfo)

{
  TaskInfo *value;
  unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
  *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  StateKind SVar3;
  Rule *pRVar4;
  _Hash_node_base _Var5;
  _Hash_node_base *p_Var6;
  BuildEngineTrace *this_01;
  int iVar7;
  undefined4 extraout_var;
  __node_ptr this_02;
  __node_ptr p_Var9;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var10;
  __node_ptr __bkt;
  size_type __n;
  ulong uVar11;
  ulong uVar12;
  __node_ptr __n_00;
  _Hash_node_base _Var13;
  undefined1 auVar14 [16];
  __buckets_alloc_type __alloc;
  TaskInfo *taskInfo;
  pointer local_a0;
  pointer pTStack_98;
  pointer local_90;
  pointer local_88;
  pointer pRStack_80;
  pointer local_78;
  RuleInfo *local_70;
  uint local_68;
  pointer local_60;
  pointer pKStack_58;
  pointer local_50;
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  long *plVar8;
  
  SVar3 = ruleInfo->state;
  if (SVar3 == Complete) {
    if ((ruleInfo->result).builtAt == this->currentEpoch) {
      return true;
    }
  }
  else if (1 < (int)SVar3) {
    if ((SVar3 & 0x7ffffffe) != InProgressWaiting) {
      if (SVar3 != NeedsToRun) {
        if (SVar3 == DoesNotNeedToRun) {
          RuleInfo::setComplete(ruleInfo,this);
          pRVar4 = (ruleInfo->rule)._M_t.
                   super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                   .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
          (*pRVar4->_vptr_Rule[4])(pRVar4,this->buildEngine,1);
          return true;
        }
        __assert_fail("ruleInfo.state == RuleInfo::StateKind::NeedsToRun",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x222,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      pRVar4 = (ruleInfo->rule)._M_t.
               super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
               .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
      iVar7 = (*pRVar4->_vptr_Rule[2])(pRVar4,this->buildEngine);
      plVar8 = (long *)CONCAT44(extraout_var,iVar7);
      if (plVar8 == (long *)0x0) {
        __assert_fail("task && \"rule action returned null task\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x226,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      std::mutex::lock(&this->taskInfosMutex);
      local_68 = 0;
      this_00 = &this->taskInfos;
      local_70 = (RuleInfo *)0x0;
      this_02 = (__node_ptr)operator_new(0x88);
      (this_02->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
      taskInfo = (TaskInfo *)0x0;
      *(long **)&(this_02->
                 super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
                 ._M_storage._M_storage = plVar8;
      *(long **)((long)&(this_02->
                        super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
                        ._M_storage._M_storage + 8) = plVar8;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x10) = 0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x20) = 0;
      local_a0 = (pointer)0x0;
      pTStack_98 = (pointer)0x0;
      local_90 = (pointer)0x0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x28) = 0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x30) = 0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x38) = 0;
      local_88 = (pointer)0x0;
      pRStack_80 = (pointer)0x0;
      local_78 = (pointer)0x0;
      *(uint *)((long)&(this_02->
                       super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
                       ._M_storage._M_storage + 0x48) = local_68;
      *(RuleInfo **)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x40) = local_70;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x50) = 0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x58) = 0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x60) = 0;
      local_60 = (pointer)0x0;
      pKStack_58 = (pointer)0x0;
      local_50 = (pointer)0x0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x68) = 0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x70) = 0;
      *(undefined8 *)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x78) = 0;
      local_48 = (pointer)0x0;
      puStack_40 = (pointer)0x0;
      local_38 = (pointer)0x0;
      uVar12 = (this->taskInfos)._M_h._M_bucket_count;
      __bkt = (__node_ptr)((ulong)plVar8 % uVar12);
      __n_00 = __bkt;
      p_Var9 = std::
               _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_node(&this_00->_M_h,(size_type)__bkt,
                              (key_type *)
                              &this_02->
                               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                              ,(__hash_code)
                               &this_02->
                                super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                             );
      if (p_Var9 == (__node_ptr)0x0) {
        auVar14 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)&(this->taskInfos)._M_h._M_rehash_policy,uVar12,
                             (this->taskInfos)._M_h._M_element_count);
        __n = auVar14._8_8_;
        if ((auVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __s = (this_00->_M_h)._M_buckets;
        }
        else {
          if (__n == 1) {
            __s = &(this->taskInfos)._M_h._M_single_bucket;
            (this->taskInfos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          }
          else {
            __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                            (&__alloc,__n);
            memset(__s,0,__n * 8);
          }
          p_Var1 = &(this->taskInfos)._M_h._M_before_begin;
          _Var5._M_nxt = (this->taskInfos)._M_h._M_before_begin._M_nxt;
          (this->taskInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          uVar12 = 0;
LAB_00149c6f:
          _Var13._M_nxt = _Var5._M_nxt;
          uVar11 = uVar12;
          if (_Var13._M_nxt != (_Hash_node_base *)0x0) {
            _Var5._M_nxt = (_Var13._M_nxt)->_M_nxt;
            uVar12 = (ulong)_Var13._M_nxt[1]._M_nxt % __n;
            if (__s[uVar12] == (_Hash_node_base *)0x0) goto LAB_00149c9e;
            (_Var13._M_nxt)->_M_nxt = __s[uVar12]->_M_nxt;
            pp_Var10 = &__s[uVar12]->_M_nxt;
            uVar12 = uVar11;
            goto LAB_00149cb5;
          }
          std::
          _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_deallocate_buckets(&this_00->_M_h);
          (this->taskInfos)._M_h._M_bucket_count = __n;
          (this->taskInfos)._M_h._M_buckets = __s;
          __bkt = (__node_ptr)((ulong)plVar8 % __n);
        }
        if (__s[(long)__bkt] == (_Hash_node_base *)0x0) {
          p_Var6 = (this->taskInfos)._M_h._M_before_begin._M_nxt;
          (this_02->super__Hash_node_base)._M_nxt = p_Var6;
          (this->taskInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)this_02;
          if (p_Var6 != (_Hash_node_base *)0x0) {
            __s[(ulong)p_Var6[1]._M_nxt % (this->taskInfos)._M_h._M_bucket_count] =
                 (__node_base_ptr)this_02;
            __s = (this->taskInfos)._M_h._M_buckets;
          }
          __s[(long)__bkt] = &(this->taskInfos)._M_h._M_before_begin;
        }
        else {
          (this_02->super__Hash_node_base)._M_nxt = __s[(long)__bkt]->_M_nxt;
          __s[(long)__bkt]->_M_nxt = (_Hash_node_base *)this_02;
        }
        psVar2 = &(this->taskInfos)._M_h._M_element_count;
        *psVar2 = *psVar2 + 1;
      }
      else {
        std::__detail::
        _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>_>_>
        ::_M_deallocate_node
                  ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>_>_>
                    *)this_02,__n_00);
        this_02 = p_Var9;
      }
      TaskInfo::~TaskInfo((TaskInfo *)&taskInfo);
      if (p_Var9 != (__node_ptr)0x0) {
        __assert_fail("result.second && \"task already registered\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x22b,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      value = (TaskInfo *)
              ((long)&(this_02->
                      super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
                      ._M_storage._M_storage + 8);
      taskInfo = value;
      pthread_mutex_unlock((pthread_mutex_t *)&this->taskInfosMutex);
      *(RuleInfo **)
       ((long)&(this_02->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x40) = ruleInfo;
      this_01 = (this->trace)._M_t.
                super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                ._M_t.
                super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
      if (this_01 != (BuildEngineTrace *)0x0) {
        llbuild::core::BuildEngineTrace::createdTaskForRule
                  (this_01,(value->task)._M_t.
                           super___uniq_ptr_impl<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llbuild::core::Task_*,_std::default_delete<llbuild::core::Task>_>
                           .super__Head_base<0UL,_llbuild::core::Task_*,_false>._M_head_impl,
                   (ruleInfo->rule)._M_t.
                   super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                   .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
      }
      ruleInfo->state = InProgressWaiting;
      RuleInfo::setPendingTaskInfo(ruleInfo,value);
      llbuild::core::DependencyKeyIDs::clear(&(ruleInfo->result).dependencies);
      (**(code **)(*plVar8 + 0x10))(plVar8,this,plVar8);
      if (((ruleInfo->result).builtAt != 0) &&
         ((((ruleInfo->rule)._M_t.
            super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
            _M_t.
            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl)->signature).value ==
          (ruleInfo->result).signature.value)) {
        (**(code **)(*plVar8 + 0x18))(plVar8,this,plVar8,&ruleInfo->result);
      }
      if (taskInfo->waitCount == 0) {
        std::
        deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ::push_back(&this->readyTaskInfos,&taskInfo);
      }
    }
    return false;
  }
  __assert_fail("ruleInfo.isScanned(this)",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                ,0x20c,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
LAB_00149c9e:
  (_Var13._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var13._M_nxt;
  __s[uVar12] = p_Var1;
  if ((_Var13._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var10 = __s + uVar11;
LAB_00149cb5:
    *pp_Var10 = _Var13._M_nxt;
  }
  goto LAB_00149c6f;
}

Assistant:

bool demandRule(RuleInfo& ruleInfo) {
    // The rule must have already been scanned.
    assert(ruleInfo.isScanned(this));

    // If the rule is complete, we are done.
    if (ruleInfo.isComplete(this))
      return true;

    // If the rule is in progress, we don't need to do anything.
    if (ruleInfo.isInProgress())
      return false;

    // If the rule isn't marked complete, but doesn't need to actually run, then
    // just update it.
    if (ruleInfo.state == RuleInfo::StateKind::DoesNotNeedToRun) {
      ruleInfo.setComplete(this);

      // Report the status change.
      ruleInfo.rule->updateStatus(buildEngine, Rule::StatusKind::IsUpToDate);

      return true;
    }

    // Otherwise, we actually need to initiate the processing of this rule.
    assert(ruleInfo.state == RuleInfo::StateKind::NeedsToRun);

    // Create the task for this rule.
    Task* task = ruleInfo.rule->createTask(buildEngine);
    assert(task && "rule action returned null task");

    // register the task
    taskInfosMutex.lock();
    auto result = taskInfos.emplace(task, TaskInfo(task));
    assert(result.second && "task already registered");
    auto taskInfo = &(result.first)->second;
    taskInfosMutex.unlock();
    taskInfo->forRuleInfo = &ruleInfo;

    if (trace)
      trace->createdTaskForRule(taskInfo->task.get(), ruleInfo.rule.get());

    // Transition the rule state.
    ruleInfo.state = RuleInfo::StateKind::InProgressWaiting;
    ruleInfo.setPendingTaskInfo(taskInfo);

    // Reset the Rule Dependencies, which we just append to during processing,
    // but we reset the others to ensure no one ever inadvertently uses them
    // during an invalid state.
    ruleInfo.result.dependencies.clear();

    // Inform the task it should start.
    {
      TracingEngineTaskCallback i(EngineTaskCallbackKind::Start, ruleInfo.keyID);
      TaskInterface iface{this, task};
      task->start(iface);
    }

    // Provide the task the prior result, if present.
    //
    // FIXME: This should perhaps just be lumped in with the start call? Or
    // alternately, maybe there should just be an API call to fetch this, and
    // the clients that want it can ask? It's cheap to provide here, so
    // ultimately this is mostly a matter of cleanliness.
    if (ruleInfo.result.builtAt != 0 &&
        ruleInfo.rule->signature == ruleInfo.result.signature) {
      TracingEngineTaskCallback i(EngineTaskCallbackKind::ProvidePriorValue, ruleInfo.keyID);
      TaskInterface iface{this, task};
      task->providePriorValue(iface, ruleInfo.result.value);
    }

    // If this task has no waiters, schedule it immediately for finalization.
    if (!taskInfo->waitCount) {
      readyTaskInfos.push_back(taskInfo);
    }

    return false;
  }